

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,void>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alloc_ref)

{
  ctrl_t *pcVar1;
  ulong uVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__p;
  
  if (7 < this->old_capacity_) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (this->old_capacity_ < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (this->old_capacity_ != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        __p = *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)((long)&this->old_heap_or_soo_ + 8);
        this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(c->heap_or_soo_).heap.slot_array.p;
        uVar2 = 0;
        do {
          this_00 = this_00 + 1;
          if (kSentinel < pcVar1[uVar2]) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair(this_00,__p);
            __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>::
            destroy<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((new_allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>> *)
                       alloc_ref,__p);
          }
          uVar2 = uVar2 + 1;
          __p = __p + 1;
        } while (uVar2 < this->old_capacity_);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::basic_string<char>>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::basic_string<char>>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }